

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O3

Expression * __thiscall soul::StructuralParser::parseConnectionPoint(StructuralParser *this)

{
  SourceCodeText *o;
  SourceCodeText *pSVar1;
  char *__s1;
  size_t sVar2;
  long lVar3;
  int iVar4;
  QualifiedIdentifier *args_00;
  CommaSeparatedList *pCVar5;
  undefined1 auVar6 [8];
  pool_ptr<soul::AST::CommaSeparatedList> args;
  pool_ptr<soul::AST::Expression> specialisationArgs;
  Context errorPos;
  undefined1 local_88 [8];
  undefined1 local_80 [16];
  UTF8Reader local_70;
  UTF8Reader local_68;
  CompileMessage local_60;
  
  o = (this->super_SOULTokeniser).location.sourceCode.object;
  if (o != (SourceCodeText *)0x0) {
    (o->super_RefCountedObject).refCount = (o->super_RefCountedObject).refCount + 1;
  }
  pSVar1 = (SourceCodeText *)(this->super_SOULTokeniser).location.location.data;
  local_68.data = (char *)this->currentScope;
  local_80._8_8_ = o;
  local_70.data = (char *)pSVar1;
  tryToParseExpressionIgnoringErrors((StructuralParser *)local_88);
  auVar6 = local_88;
  if (local_88 == (undefined1  [8])0x0) {
    if ((SourceCodeText *)(this->super_SOULTokeniser).input.data != pSVar1) {
      (this->super_SOULTokeniser).input.data = (char *)pSVar1;
      Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
      ::skip(&this->super_SOULTokeniser);
    }
    __s1 = (this->super_SOULTokeniser).currentType.text;
    if (__s1 != "$identifier") {
      if (__s1 == (char *)0x0) {
LAB_001fde49:
        CompileMessageHelpers::createMessage<>
                  (&local_60,syntax,error,"Expected a processor name or endpoint");
        AST::Context::throwError((Context *)(local_80 + 8),&local_60,false);
      }
      iVar4 = strcmp(__s1,"$identifier");
      if (iVar4 != 0) goto LAB_001fde49;
    }
    args_00 = parseQualifiedIdentifier(this);
    local_88 = (undefined1  [8])0x0;
    parseSpecialisationArgs((StructuralParser *)local_80);
    lVar3 = CONCAT71(local_80._1_7_,local_80[0]);
    if (lVar3 != 0) {
      local_88 = (undefined1  [8])
                 __dynamic_cast(lVar3,&AST::Expression::typeinfo,&AST::CommaSeparatedList::typeinfo,
                                0);
      if (local_88 == (undefined1  [8])0x0) {
        pCVar5 = PoolAllocator::allocate<soul::AST::CommaSeparatedList,soul::AST::Context&>
                           (&this->allocator->pool,(Context *)(lVar3 + 0x10));
        local_88 = (undefined1  [8])pCVar5;
        if ((Expression *)CONCAT71(local_80._1_7_,local_80[0]) == (Expression *)0x0) {
          throwInternalCompilerError("object != nullptr","operator*",0x3b);
        }
        ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::reserve
                  (&pCVar5->items,(pCVar5->items).numActive + 1);
        sVar2 = (pCVar5->items).numActive;
        (pCVar5->items).items[sVar2].object = (Expression *)CONCAT71(local_80._1_7_,local_80[0]);
        (pCVar5->items).numActive = sVar2 + 1;
      }
    }
    local_80[0] = false;
    auVar6 = (undefined1  [8])
             PoolAllocator::
             allocate<soul::AST::CallOrCast,soul::AST::QualifiedIdentifier&,soul::pool_ptr<soul::AST::CommaSeparatedList>&,bool>
                       (&this->allocator->pool,args_00,
                        (pool_ptr<soul::AST::CommaSeparatedList> *)local_88,(bool *)local_80);
  }
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(o);
  return &((CommaSeparatedList *)auVar6)->super_Expression;
}

Assistant:

AST::Expression& parseConnectionPoint()
    {
        auto errorPos = getContext();
        auto startPos = getCurrentTokeniserPosition();

        if (auto e = tryToParseExpressionIgnoringErrors())
            return *e;

        resetPosition (startPos);

        if (! matches (Token::identifier))
            errorPos.throwError (Errors::expectedProcessorOrEndpoint());

        auto& processorName = parseQualifiedIdentifier();
        pool_ptr<AST::CommaSeparatedList> args;

        if (auto specialisationArgs = parseSpecialisationArgs())
        {
            args = cast<AST::CommaSeparatedList> (specialisationArgs);

            if (args == nullptr)
            {
                args = allocate<AST::CommaSeparatedList> (specialisationArgs->context);
                args->items.push_back (*specialisationArgs);
            }
        }

        return allocate<AST::CallOrCast> (processorName, args, false);
    }